

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  _Bool _Var5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar2 = it->container_index;
  if (iVar2 < 0) {
LAB_0011a119:
    it->has_value = false;
    return false;
  }
  iVar3 = (it->parent->high_low_container).size;
  if (iVar2 < iVar3) {
    uVar1 = it->typecode;
    if (uVar1 == '\x03') {
      if (it->current_value == 0) goto LAB_0011a119;
      uVar8 = it->current_value - 1;
      it->current_value = uVar8;
      lVar4 = *(long *)((long)it->container + 8);
      iVar3 = it->run_index;
      if (uVar8 < ((uint)*(ushort *)(lVar4 + (long)iVar3 * 4) | it->highbits)) {
        uVar8 = iVar3 - 1;
        it->run_index = uVar8;
        if (0 < iVar3) {
          uVar8 = (uint)*(ushort *)(lVar4 + 2 + (ulong)uVar8 * 4) +
                  (uint)*(ushort *)(lVar4 + (ulong)uVar8 * 4) | it->highbits;
          goto LAB_0011a10e;
        }
        goto LAB_0011a121;
      }
    }
    else if (uVar1 == '\x02') {
      iVar3 = it->in_container_index;
      uVar8 = iVar3 - 1;
      it->in_container_index = uVar8;
      if (iVar3 < 1) goto LAB_0011a121;
      uVar8 = (uint)*(ushort *)(*(long *)((long)it->container + 8) + (ulong)uVar8 * 2) |
              it->highbits;
LAB_0011a10e:
      it->current_value = uVar8;
    }
    else {
      if (uVar1 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x4164,"_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *)")
        ;
      }
      iVar3 = it->in_container_index;
      uVar8 = iVar3 - 1;
      it->in_container_index = uVar8;
      if (iVar3 < 1) {
LAB_0011a121:
        it->container_index = iVar2 + -1;
        goto LAB_0011a126;
      }
      uVar7 = uVar8 >> 6;
      lVar4 = *(long *)((long)it->container + 8);
      uVar9 = (ulong)(*(long *)(lVar4 + (ulong)uVar7 * 8) << (~(byte)uVar8 & 0x3f)) >>
              (~(byte)uVar8 & 0x3f);
      if (uVar9 == 0) {
        uVar6 = (ulong)(uVar8 >> 6);
        do {
          if ((long)uVar6 < 1) goto LAB_0011a121;
          uVar9 = *(ulong *)(lVar4 + -8 + uVar6 * 8);
          uVar6 = uVar6 - 1;
        } while (uVar9 == 0);
        uVar7 = (uint)uVar6;
      }
      lVar4 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = (uVar7 << 6 | (uint)lVar4 ^ 0x3f) ^ 0x3f;
      it->in_container_index = uVar8;
      it->current_value = uVar8 | it->highbits;
    }
    it->has_value = true;
    _Var5 = true;
  }
  else {
    it->container_index = iVar3 + -1;
LAB_0011a126:
    _Var5 = loadlastvalue(it);
    it->has_value = _Var5;
  }
  return _Var5;
}

Assistant:

bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index < 0) {
        return (it->has_value = false);
    }
    if (it->container_index >= it->parent->high_low_container.size) {
        it->container_index = it->parent->high_low_container.size - 1;
        return (it->has_value = loadlastvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const bitset_container_t* bitset_container = (const bitset_container_t*)it->container;
            int32_t wordindex = it->in_container_index / 64;
            uint64_t word = bitset_container->words[wordindex] & (UINT64_MAX >> (63 - (it->in_container_index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bitset_container->words[wordindex];
            }
            if (word == 0)
                break;

            int num_leading_zeros = __builtin_clzll(word);
            it->in_container_index = (wordindex * 64) + (63 - num_leading_zeros);
            it->current_value = it->highbits | it->in_container_index;
            return (it->has_value = true);
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const array_container_t* array_container = (const array_container_t*)it->container;
            it->current_value = it->highbits | array_container->array[it->in_container_index];
            return (it->has_value = true);
        }
        case RUN_CONTAINER_TYPE: {
            if(it->current_value == 0)
                return (it->has_value = false);

            const run_container_t* run_container = (const run_container_t*)it->container;
            if (--it->current_value >= (it->highbits | run_container->runs[it->run_index].value)) {
                return (it->has_value = true);
            }

            if (--it->run_index < 0)
                break;

            it->current_value = it->highbits | (run_container->runs[it->run_index].value +
                                                run_container->runs[it->run_index].length);
            return (it->has_value = true);
        }
        default:
            // if this ever happens, bug!
            assert(false);
    }  // switch (typecode)

    // moving to previous container
    it->container_index--;
    return (it->has_value = loadlastvalue(it));
}